

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall ChainstateManager::~ChainstateManager(ChainstateManager *this)

{
  _Manager_type p_Var1;
  Chainstate *__ptr_00;
  _Head_base<0UL,_Chainstate_*,_false> __ptr_01;
  pointer *__ptr;
  long lVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  VersionBitsCache::Clear(&this->m_versionbitscache);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  lVar2 = 0xd58;
  do {
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                 *)((long)((this->m_warningcache)._M_elems + -1) + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != 0xcf8);
  std::
  _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
  ::~_Rb_tree(&(this->m_failed_blocks)._M_t);
  ValidationCache::~ValidationCache(&this->m_validation_cache);
  ::node::BlockManager::~BlockManager(&this->m_blockman);
  std::filesystem::__cxx11::path::~path(&(this->m_options).datadir.super_path);
  p_Var1 = (this->snapshot_download_completed).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->snapshot_download_completed,
              (_Any_data *)&this->snapshot_download_completed,__destroy_functor);
  }
  CCheckQueue<CScriptCheck>::~CCheckQueue(&this->m_script_check_queue);
  lVar2 = 0x570;
  do {
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                 *)((long)((this->m_warningcache)._M_elems + -1) + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != 0);
  __ptr_00 = (this->m_snapshot_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (__ptr_00 != (Chainstate *)0x0) {
    std::default_delete<Chainstate>::operator()
              ((default_delete<Chainstate> *)&this->m_snapshot_chainstate,__ptr_00);
  }
  (this->m_snapshot_chainstate)._M_t.
  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  __ptr_01._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (__ptr_01._M_head_impl != (Chainstate *)0x0) {
    std::default_delete<Chainstate>::operator()
              ((default_delete<Chainstate> *)this,__ptr_01._M_head_impl);
  }
  (this->m_ibd_chainstate)._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
  _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::~ChainstateManager()
{
    LOCK(::cs_main);

    m_versionbitscache.Clear();
}